

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O2

unsigned_long ndiHexToUnsignedLong(char *string,int n)

{
  char cVar1;
  unsigned_long uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  
  uVar3 = 0;
  uVar4 = (ulong)(uint)n;
  if (n < 1) {
    uVar4 = uVar3;
  }
  uVar2 = 0;
  while( true ) {
    if (uVar4 == uVar3) {
      return uVar2;
    }
    cVar1 = string[uVar3];
    iVar5 = -0x57;
    if (((5 < (byte)(cVar1 + 0x9fU)) && (iVar5 = -0x37, 5 < (byte)(cVar1 + 0xbfU))) &&
       (iVar5 = -0x30, 9 < (byte)(cVar1 - 0x30U))) break;
    uVar2 = uVar2 << 4 | (ulong)(uint)(iVar5 + cVar1);
    uVar3 = uVar3 + 1;
  }
  return uVar2;
}

Assistant:

ndicapiExport unsigned long ndiHexToUnsignedLong(const char* string, int n)
{
  int i;
  unsigned long result = 0;
  int c;

  for (i = 0; i < n; i++)
  {
    c = string[i];
    if (c >= 'a' && c <= 'f')
    {
      result = (result << 4) | (c + (10 - 'a'));
    }
    else if (c >= 'A' && c <= 'F')
    {
      result = (result << 4) | (c + (10 - 'A'));
    }
    else if (c >= '0' && c <= '9')
    {
      result = (result << 4) | (c - '0');
    }
    else
    {
      break;
    }
  }

  return result;
}